

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O1

void __thiscall QLatin1StringMatcher::setSearcher(QLatin1StringMatcher *this)

{
  anon_union_256_2_31108aa6_for_QLatin1StringMatcher_2 *paVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (this->m_cs == CaseSensitive) {
    paVar1 = &this->field_2;
    uVar3 = (this->m_pattern).m_size;
    pcVar4 = (this->m_pattern).m_data;
    memset(paVar1,0,0x100);
    uVar8 = 0xff;
    if (uVar3 < 0xff) {
      uVar8 = uVar3;
    }
    memset(paVar1,(int)uVar8,0x100);
    if (uVar3 != 0) {
      pbVar9 = (byte *)(pcVar4 + (uVar3 - uVar8));
      uVar6 = (int)uVar8 - 1;
      do {
        bVar2 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        cVar5 = (char)uVar6;
        *(char *)((long)paVar1 + (ulong)bVar2) = cVar5;
        uVar6 = (uint)(byte)(cVar5 - 1);
      } while (cVar5 != '\0');
    }
  }
  else {
    uVar3 = (this->m_pattern).m_size;
    uVar8 = 0x100;
    if ((long)uVar3 < 0x100) {
      uVar8 = uVar3;
    }
    if (0 < (long)uVar3) {
      pcVar4 = (this->m_pattern).m_data;
      uVar7 = 0;
      do {
        this->m_foldBuffer[uVar7] = ""[(byte)pcVar4[uVar7]];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    paVar1 = &this->field_2;
    memset(paVar1,0,0x100);
    uVar7 = 0xff;
    if (uVar8 < 0xff) {
      uVar7 = uVar8;
    }
    memset(paVar1,(int)uVar7,0x100);
    if (uVar3 != 0) {
      pbVar9 = (byte *)((long)this + (uVar8 - uVar7) + 0x120);
      uVar6 = (int)uVar7 - 1;
      do {
        bVar2 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        cVar5 = (char)uVar6;
        *(char *)((long)paVar1 + (ulong)bVar2) = cVar5;
        uVar6 = (uint)(byte)(cVar5 - 1);
      } while (cVar5 != '\0');
    }
  }
  return;
}

Assistant:

void QLatin1StringMatcher::setSearcher() noexcept
{
    if (m_cs == Qt::CaseSensitive) {
        new (&m_caseSensitiveSearcher) CaseSensitiveSearcher(m_pattern.data(), m_pattern.end());
    } else {
        QtPrivate::QCaseInsensitiveLatin1Hash foldCase;
        qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        for (qsizetype i = 0; i < bufferSize; ++i)
            m_foldBuffer[i] = static_cast<char>(foldCase(m_pattern[i].toLatin1()));

        new (&m_caseInsensitiveSearcher)
                CaseInsensitiveSearcher(m_foldBuffer, &m_foldBuffer[bufferSize]);
    }
}